

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O0

bool_t prf_material_palette_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  float32_t *pfVar5;
  undefined8 in_RDX;
  long *in_RSI;
  bfile_t *in_RDI;
  float32_t fVar6;
  node_data_conflict7 *data;
  int i;
  int count;
  int pos;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar7;
  undefined8 in_stack_ffffffffffffffc8;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  pool_t pool_id;
  int iVar9;
  bool_t local_4;
  
  uVar8 = (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pool_id = (pool_t)((uint)in_stack_ffffffffffffffdc >> 0x10);
  uVar1 = bf_get_uint16_be((bfile_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0))
  ;
  in_RDI->flags = uVar1;
  if (in_RDI->flags == prf_material_palette_info.opcode) {
    uVar1 = bf_get_uint16_be((bfile_t *)
                             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    *(uint16_t *)&in_RDI->field_0x2 = uVar1;
    if ((4 < *(ushort *)&in_RDI->field_0x2) && (in_RDI->file == (FILE *)0x0)) {
      if (*(short *)(*in_RSI + 8) == 0) {
        pFVar4 = (FILE *)malloc((long)(int)(*(ushort *)&in_RDI->field_0x2 - 4));
        in_RDI->file = pFVar4;
      }
      else {
        pFVar4 = (FILE *)pool_malloc(pool_id,in_stack_ffffffffffffffd8);
        in_RDI->file = pFVar4;
      }
      if (in_RDI->file == (FILE *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        bf_rewind((bfile_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),uVar8);
        return 0;
      }
    }
    iVar9 = 4;
    while( true ) {
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5 = (float32_t *)((long)in_RDI->file + (long)iVar9 + -4);
      iVar3 = iVar9;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar9 + 4) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      *pfVar5 = fVar6;
      iVar2 = iVar9 + 4;
      iVar3 = iVar2;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar9 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[1] = fVar6;
      iVar9 = iVar2 + 4;
      iVar3 = iVar9;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar2 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[2] = fVar6;
      iVar2 = iVar9 + 4;
      iVar3 = iVar2;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar9 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[3] = fVar6;
      iVar9 = iVar2 + 4;
      iVar3 = iVar9;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar2 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[4] = fVar6;
      iVar2 = iVar9 + 4;
      iVar3 = iVar2;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar9 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[5] = fVar6;
      iVar9 = iVar2 + 4;
      iVar3 = iVar9;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar2 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[6] = fVar6;
      iVar2 = iVar9 + 4;
      iVar3 = iVar2;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar9 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[7] = fVar6;
      iVar9 = iVar2 + 4;
      iVar3 = iVar9;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar2 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[8] = fVar6;
      iVar2 = iVar9 + 4;
      iVar3 = iVar2;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar9 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[9] = fVar6;
      iVar9 = iVar2 + 4;
      iVar3 = iVar9;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar2 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[10] = fVar6;
      iVar2 = iVar9 + 4;
      iVar3 = iVar2;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar9 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[0xb] = fVar6;
      iVar9 = iVar2 + 4;
      iVar3 = iVar9;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar2 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[0xc] = fVar6;
      iVar2 = iVar9 + 4;
      iVar3 = iVar2;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar9 + 8) break;
      fVar6 = bf_get_float32_be((bfile_t *)
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[0xd] = fVar6;
      iVar9 = iVar2 + 4;
      iVar3 = iVar9;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar2 + 8) break;
      fVar6 = (float32_t)
              bf_get_uint32_be((bfile_t *)
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar8 = (uint)((ulong)in_RDX >> 0x20);
      pfVar5[0xe] = fVar6;
      iVar3 = iVar9 + 4;
      if ((int)(uint)*(ushort *)&in_RDI->field_0x2 < iVar9 + 0x10) break;
      bf_read(in_RDI,(uint8_t *)in_RSI,uVar8);
      iVar9 = iVar3 + 0xc;
      iVar3 = 0;
      while( true ) {
        bVar7 = false;
        if (iVar3 < 0x1c) {
          bVar7 = iVar9 + 4 <= (int)(uint)*(ushort *)&in_RDI->field_0x2;
        }
        if (bVar7 == false) break;
        fVar6 = (float32_t)bf_get_uint32_be((bfile_t *)CONCAT17(bVar7,in_stack_ffffffffffffffc0));
        pfVar5[(long)iVar3 + 0x12] = fVar6;
        iVar9 = iVar9 + 4;
        iVar3 = iVar3 + 1;
      }
      in_stack_ffffffffffffffc7 = 0;
    }
    if (iVar3 < (int)(uint)*(ushort *)&in_RDI->field_0x2) {
      bf_read(in_RDI,(uint8_t *)in_RSI,uVar8);
    }
    local_4 = 1;
  }
  else {
    prf_error(9,"tried material palette load method for node of type %d.",(ulong)in_RDI->flags);
    bf_rewind((bfile_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),uVar8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
bool_t
prf_material_palette_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos, count;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) { /* node preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    count = 0;
    do {
        int i;
        node_data * data;
        data = (node_data *) (node->data + pos - 4);

        if ( node->length < (pos + 4) ) break;
        data->ambient_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->diffuse_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->specular_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->emissive_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->shininess = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->alpha = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;

        if ( node->length < (pos + 12) ) break;
        bf_read( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        for ( i = 0; i < 28 && node->length >= (pos + 4); i++ ) {
            data->reserved1[i] = bf_get_uint32_be( bfile ); pos += 4;
        }
        count++;
    } while ( TRUE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4, node->length - pos );

    return TRUE;
}